

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O2

QNetworkReply * __thiscall
QNetworkAccessManagerPrivate::postProcess(QNetworkAccessManagerPrivate *this,QNetworkReply *reply)

{
  QNetworkAccessManager *manager;
  undefined4 *puVar1;
  long in_FS_OFFSET;
  uint in_stack_ffffffffffffff7c;
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  manager = *(QNetworkAccessManager **)&this->field_0x8;
  QNetworkReplyPrivate::setManager(reply,manager);
  local_48 = QNetworkReply::finished;
  local_40 = 0;
  puVar1 = (undefined4 *)operator_new(0x20);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qnetworkaccessmanager.cpp:1576:16),_QtPrivate::List<>,_void>
       ::impl;
  *(QNetworkAccessManagerPrivate **)(puVar1 + 4) = this;
  *(QNetworkReply **)(puVar1 + 6) = reply;
  QObject::connectImpl
            (local_50,(void **)reply,(QObject *)&local_48,(void **)reply,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar1,(int *)((ulong)in_stack_ffffffffffffff7c << 0x20),
             (QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  local_48 = QNetworkReply::encrypted;
  local_40 = 0;
  puVar1 = (undefined4 *)operator_new(0x20);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qnetworkaccessmanager.cpp:1581:16),_QtPrivate::List<>,_void>
       ::impl;
  *(QNetworkAccessManagerPrivate **)(puVar1 + 4) = this;
  *(QNetworkReply **)(puVar1 + 6) = reply;
  QObject::connectImpl
            (local_58,(void **)reply,(QObject *)&local_48,(void **)reply,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar1,(int *)((ulong)in_stack_ffffffffffffff7c << 0x20),
             (QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  QObject::connect(local_60,(char *)reply,(QObject *)"2sslErrors(QList<QSslError>)",(char *)manager,
                   0x23dd95);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QObject::connect(local_68,(char *)reply,
                   (QObject *)"2preSharedKeyAuthenticationRequired(QSslPreSharedKeyAuthenticator*)",
                   (char *)manager,0x23ddfe);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return reply;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply *QNetworkAccessManagerPrivate::postProcess(QNetworkReply *reply)
{
    Q_Q(QNetworkAccessManager);
    QNetworkReplyPrivate::setManager(reply, q);
    q->connect(reply, &QNetworkReply::finished, reply,
               [this, reply]() { _q_replyFinished(reply); });
#ifndef QT_NO_SSL
    /* In case we're compiled without SSL support, we don't have this signal and we need to
     * avoid getting a connection error. */
    q->connect(reply, &QNetworkReply::encrypted, reply,
               [this, reply]() { _q_replyEncrypted(reply); });
    q->connect(reply, SIGNAL(sslErrors(QList<QSslError>)), SLOT(_q_replySslErrors(QList<QSslError>)));
    q->connect(reply, SIGNAL(preSharedKeyAuthenticationRequired(QSslPreSharedKeyAuthenticator*)), SLOT(_q_replyPreSharedKeyAuthenticationRequired(QSslPreSharedKeyAuthenticator*)));
#endif

    return reply;
}